

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  return_type rVar1;
  int16_t iVar2;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory;
  Offset<MyGame::Sample::Monster> root;
  int iVar3;
  String *pSVar4;
  Vec3 *pVVar5;
  Vector<unsigned_char> *this;
  Monster *this_00;
  char *__assertion;
  Vec3 local_88;
  uchar inv_data [10];
  FlatBufferBuilder builder;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&builder,0x400);
  local_88.x_ = 1.0;
  local_88.y_ = 2.0;
  local_88.z_ = 3.0;
  name = flatbuffers::FlatBufferBuilder::CreateString(&builder,"MyMonster");
  inv_data[0] = '\0';
  inv_data[1] = '\x01';
  inv_data[2] = '\x02';
  inv_data[3] = '\x03';
  inv_data[4] = '\x04';
  inv_data[5] = '\x05';
  inv_data[6] = '\x06';
  inv_data[7] = '\a';
  inv_data[8] = '\b';
  inv_data[9] = '\t';
  inventory = flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>(&builder,inv_data,10);
  root = MyGame::Sample::CreateMonster(&builder,&local_88,0x96,0x50,name,inventory,'\x02');
  flatbuffers::FlatBufferBuilder::Finish<MyGame::Sample::Monster>(&builder,root);
  this_00 = (Monster *)(builder.buf_.cur_ + *(uint *)builder.buf_.cur_);
  iVar2 = MyGame::Sample::Monster::hp(this_00);
  if (iVar2 == 0x50) {
    iVar2 = MyGame::Sample::Monster::mana(this_00);
    if (iVar2 == 0x96) {
      pSVar4 = MyGame::Sample::Monster::name(this_00);
      iVar3 = strcmp((char *)(pSVar4 + 1),"MyMonster");
      if (iVar3 == 0) {
        pVVar5 = MyGame::Sample::Monster::pos(this_00);
        if (pVVar5 == (Vec3 *)0x0) {
          __assertion = "pos";
          __line = 0x37;
        }
        else if ((pVVar5->z_ != 3.0) || (NAN(pVVar5->z_))) {
          __assertion = "pos->z() == 3";
          __line = 0x38;
        }
        else {
          this = MyGame::Sample::Monster::inventory(this_00);
          if (this == (Vector<unsigned_char> *)0x0) {
            __assertion = "inv";
            __line = 0x3b;
          }
          else {
            rVar1 = flatbuffers::Vector<unsigned_char>::Get(this,9);
            if (rVar1 == '\t') {
              flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(&builder);
              return 0;
            }
            __assertion = "inv->Get(9) == 9";
            __line = 0x3c;
          }
        }
      }
      else {
        __assertion = "!strcmp(monster->name()->c_str(), \"MyMonster\")";
        __line = 0x34;
      }
    }
    else {
      __assertion = "monster->mana() == 150";
      __line = 0x33;
    }
  }
  else {
    __assertion = "monster->hp() == 80";
    __line = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                ,__line,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char *argv[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory,
                            Color_Blue);

  builder.Finish(mloc);
  // We now have a FlatBuffer we can store or send somewhere.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it straight away.
  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(!strcmp(monster->name()->c_str(), "MyMonster"));

  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3);

  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
}